

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3WhereSplit(WhereClause *pWC,Expr *pExpr,u8 op)

{
  u8 uVar1;
  Expr *p;
  ExprList_item *pEVar2;
  
  p = pExpr;
  if (pExpr != (Expr *)0x0) {
    do {
      while ((pExpr->flags & 0x82000) == 0) {
        uVar1 = pExpr->op;
LAB_001929d6:
        pWC->op = op;
        if (uVar1 != op) {
          whereClauseInsert(pWC,p,0);
          return;
        }
        sqlite3WhereSplit(pWC,pExpr->pLeft,op);
        pExpr = pExpr->pRight;
        p = pExpr;
        if (pExpr == (Expr *)0x0) goto LAB_001929f5;
      }
      if ((pExpr->flags >> 0x13 & 1) == 0) {
        uVar1 = pExpr->op;
        if (uVar1 != 'r') goto LAB_001929d6;
        pEVar2 = (ExprList_item *)&pExpr->pLeft;
      }
      else {
        pEVar2 = ((pExpr->x).pList)->a;
      }
      pExpr = pEVar2->pExpr;
    } while (pExpr != (Expr *)0x0);
  }
LAB_001929f5:
  pWC->op = op;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3WhereSplit(WhereClause *pWC, Expr *pExpr, u8 op){
  Expr *pE2 = sqlite3ExprSkipCollateAndLikely(pExpr);
  pWC->op = op;
  assert( pE2!=0 || pExpr==0 );
  if( pE2==0 ) return;
  if( pE2->op!=op ){
    whereClauseInsert(pWC, pExpr, 0);
  }else{
    sqlite3WhereSplit(pWC, pE2->pLeft, op);
    sqlite3WhereSplit(pWC, pE2->pRight, op);
  }
}